

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crate-reader.cc
# Opt level: O2

bool __thiscall
tinyusdz::crate::CrateReader::ReadIndices
          (CrateReader *this,
          vector<tinyusdz::crate::Index,_std::allocator<tinyusdz::crate::Index>_> *indices)

{
  void *__buf;
  void *pvVar1;
  bool bVar2;
  ostream *poVar3;
  ulong uVar4;
  ssize_t sVar5;
  char *pcVar6;
  uint64_t n;
  ostringstream ss_e;
  ulong local_1c0 [5];
  ostringstream local_198 [376];
  
  bVar2 = StreamReader::read8(this->_sr,local_1c0);
  if (bVar2) {
    if ((this->_config).maxNumIndices < local_1c0[0]) {
      ::std::__cxx11::ostringstream::ostringstream(local_198);
      poVar3 = ::std::operator<<((ostream *)local_198,"[error]");
      poVar3 = ::std::operator<<(poVar3,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                                );
      poVar3 = ::std::operator<<(poVar3,"[Crate]");
      poVar3 = ::std::operator<<(poVar3,":");
      poVar3 = ::std::operator<<(poVar3,"ReadIndices");
      poVar3 = ::std::operator<<(poVar3,"():");
      poVar3 = (ostream *)::std::ostream::operator<<(poVar3,0xda);
      ::std::operator<<(poVar3," ");
      pcVar6 = "Too many indices.";
    }
    else {
      if (local_1c0[0] == 0) {
        return true;
      }
      __buf = (void *)(local_1c0[0] * 4);
      pvVar1 = (void *)this->_sr->length_;
      if (__buf < pvVar1 || (long)__buf - (long)pvVar1 == 0) {
        uVar4 = this->_memoryUsage + (long)__buf;
        this->_memoryUsage = uVar4;
        if ((this->_config).maxMemoryBudget < uVar4) {
          ::std::__cxx11::ostringstream::ostringstream(local_198);
          poVar3 = ::std::operator<<((ostream *)local_198,"[error]");
          poVar3 = ::std::operator<<(poVar3,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                                    );
          poVar3 = ::std::operator<<(poVar3,"[Crate]");
          poVar3 = ::std::operator<<(poVar3,":");
          poVar3 = ::std::operator<<(poVar3,"ReadIndices");
          poVar3 = ::std::operator<<(poVar3,"():");
          poVar3 = (ostream *)::std::ostream::operator<<(poVar3,0xe9);
          ::std::operator<<(poVar3," ");
          pcVar6 = "Reached to max memory budget.";
        }
        else {
          ::std::vector<tinyusdz::crate::Index,_std::allocator<tinyusdz::crate::Index>_>::resize
                    (indices,local_1c0[0]);
          sVar5 = StreamReader::read(this->_sr,(int)__buf,__buf,
                                     (size_t)(indices->
                                             super__Vector_base<tinyusdz::crate::Index,_std::allocator<tinyusdz::crate::Index>_>
                                             )._M_impl.super__Vector_impl_data._M_start);
          if ((long)__buf - sVar5 == 0) {
            return true;
          }
          ::std::__cxx11::ostringstream::ostringstream(local_198);
          poVar3 = ::std::operator<<((ostream *)local_198,"[error]");
          poVar3 = ::std::operator<<(poVar3,
                                     "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                                    );
          poVar3 = ::std::operator<<(poVar3,"[Crate]");
          poVar3 = ::std::operator<<(poVar3,":");
          poVar3 = ::std::operator<<(poVar3,"ReadIndices");
          poVar3 = ::std::operator<<(poVar3,"():");
          poVar3 = (ostream *)::std::ostream::operator<<(poVar3,0xef);
          ::std::operator<<(poVar3," ");
          pcVar6 = "Failed to read Indices array.";
        }
      }
      else {
        ::std::__cxx11::ostringstream::ostringstream(local_198);
        poVar3 = ::std::operator<<((ostream *)local_198,"[error]");
        poVar3 = ::std::operator<<(poVar3,
                                   "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/crate-reader.cc"
                                  );
        poVar3 = ::std::operator<<(poVar3,"[Crate]");
        poVar3 = ::std::operator<<(poVar3,":");
        poVar3 = ::std::operator<<(poVar3,"ReadIndices");
        poVar3 = ::std::operator<<(poVar3,"():");
        poVar3 = (ostream *)::std::ostream::operator<<(poVar3,0xe6);
        ::std::operator<<(poVar3," ");
        pcVar6 = "Indices data exceeds USDC size.";
      }
    }
    poVar3 = ::std::operator<<((ostream *)local_198,pcVar6);
    ::std::operator<<(poVar3,"\n");
    ::std::__cxx11::stringbuf::str();
    ::std::__cxx11::string::append((string *)&this->_err);
    ::std::__cxx11::string::_M_dispose();
    ::std::__cxx11::ostringstream::~ostringstream(local_198);
  }
  return false;
}

Assistant:

bool CrateReader::ReadIndices(std::vector<crate::Index> *indices) {
  uint64_t n;
  if (!_sr->read8(&n)) {
    return false;
  }

  if (n > _config.maxNumIndices) {
    PUSH_ERROR_AND_RETURN_TAG(kTag, "Too many indices.");
  }

  if (n == 0) {
    return true;
  }

  DCOUT("ReadIndices: n = " << n);

  size_t datalen = size_t(n) * sizeof(crate::Index);

  if (datalen > _sr->size()) {
    PUSH_ERROR_AND_RETURN_TAG(kTag, "Indices data exceeds USDC size.");
  }

  CHECK_MEMORY_USAGE(datalen);

  indices->resize(size_t(n));

  if (datalen != _sr->read(datalen, datalen,
                          reinterpret_cast<uint8_t *>(indices->data()))) {
    PUSH_ERROR_AND_RETURN_TAG(kTag, "Failed to read Indices array.");
  }

  return true;
}